

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::vcd_unsigned_int_trace::write(vcd_unsigned_int_trace *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  uint bit_mask;
  int bitindex;
  char compdata [1000];
  char rawdata [1000];
  undefined1 local_7f9;
  uint local_7f0;
  int local_7ec;
  char local_7e8 [8];
  char *in_stack_fffffffffffff820;
  char *in_stack_fffffffffffff828;
  vcd_trace *in_stack_fffffffffffff830;
  undefined1 local_3f8 [1000];
  FILE *local_10;
  vcd_unsigned_int_trace *local_8;
  
  local_10 = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if ((*this->object & this->mask) == *this->object) {
    local_7f0 = 1 << ((char)(this->super_vcd_trace).bit_width - 1U & 0x1f);
    for (local_7ec = 0; local_7ec < (this->super_vcd_trace).bit_width; local_7ec = local_7ec + 1) {
      local_7f9 = 0x31;
      if ((*this->object & local_7f0) == 0) {
        local_7f9 = 0x30;
      }
      local_3f8[local_7ec] = local_7f9;
      local_7f0 = local_7f0 >> 1;
    }
  }
  else {
    for (local_7ec = 0; local_7ec < (this->super_vcd_trace).bit_width; local_7ec = local_7ec + 1) {
      local_3f8[local_7ec] = 0x78;
    }
  }
  local_3f8[local_7ec] = 0;
  vcd_trace::compose_data_line
            (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  fputs(local_7e8,local_10);
  this->old_value = *this->object;
  return (ssize_t)this;
}

Assistant:

void
vcd_unsigned_int_trace::write(FILE* f)
{
    char rawdata[1000];
    char compdata[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++){
            rawdata[bitindex] = 'x';
        }
    }
    else {
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    rawdata[bitindex] = '\0';
    compose_data_line(rawdata, compdata);
    std::fputs(compdata, f);
    old_value = object;
}